

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::CPPpragma(TPpContext *this,TPpToken *ppToken)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s_00;
  char SrcStrName [2];
  TSourceLoc loc;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  tokens;
  char local_9a [2];
  TString *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  TPoolAllocator *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (TPoolAllocator *)0x0;
  uStack_50 = 0;
  local_58 = GetThreadPoolAllocator();
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_88 = *(undefined8 *)&(ppToken->loc).column;
  local_98 = (ppToken->loc).name;
  uStack_90._0_4_ = (ppToken->loc).string;
  uStack_90._4_4_ = (ppToken->loc).line;
  iVar1 = scanToken(this,ppToken);
  __s = ppToken->name;
  do {
    if ((iVar1 - 0x98U < 9) || (iVar1 == 0xa2)) {
      local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      sVar2 = strlen(__s);
      pcVar3 = __s + sVar2;
      __s_00 = __s;
    }
    else {
      if (iVar1 == -1) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&local_98,"directive must end with a newline","#pragma","");
        return -1;
      }
      if (iVar1 == 10) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3a])
                  (this->parseContext,&local_98,&local_58);
        return 10;
      }
      local_9a[0] = (char)iVar1;
      local_9a[1] = 0;
      local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      __s_00 = local_9a;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      sVar2 = strlen(__s_00);
      pcVar3 = local_9a + sVar2;
    }
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,
               __s_00,pcVar3);
    std::
    vector<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
              ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&local_58,&local_80);
    iVar1 = scanToken(this,ppToken);
  } while( true );
}

Assistant:

int TPpContext::CPPpragma(TPpToken* ppToken)
{
    char SrcStrName[2];
    TVector<TString> tokens;

    TSourceLoc loc = ppToken->loc;  // because we go to the next line before processing
    int token = scanToken(ppToken);
    while (token != '\n' && token != EndOfInput) {
        switch (token) {
        case PpAtomIdentifier:
        case PpAtomConstInt:
        case PpAtomConstUint:
        case PpAtomConstInt64:
        case PpAtomConstUint64:
        case PpAtomConstInt16:
        case PpAtomConstUint16:
        case PpAtomConstFloat:
        case PpAtomConstDouble:
        case PpAtomConstFloat16:
            tokens.push_back(ppToken->name);
            break;
        default:
            SrcStrName[0] = (char)token;
            SrcStrName[1] = '\0';
            tokens.push_back(SrcStrName);
        }
        token = scanToken(ppToken);
    }

    if (token == EndOfInput)
        parseContext.ppError(loc, "directive must end with a newline", "#pragma", "");
    else
        parseContext.handlePragma(loc, tokens);

    return token;
}